

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_tls_write_point
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,int format,size_t *olen,uchar *buf,
              size_t blen)

{
  int ret;
  size_t blen_local;
  uchar *buf_local;
  size_t *olen_local;
  int format_local;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  if (blen == 0) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    grp_local._4_4_ = mbedtls_ecp_point_write_binary(grp,pt,format,olen,buf + 1,blen - 1);
    if (grp_local._4_4_ == 0) {
      *buf = (uchar)*olen;
      *olen = *olen + 1;
      grp_local._4_4_ = 0;
    }
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_tls_write_point( const mbedtls_ecp_group *grp, const mbedtls_ecp_point *pt,
                         int format, size_t *olen,
                         unsigned char *buf, size_t blen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    ECP_VALIDATE_RET( grp  != NULL );
    ECP_VALIDATE_RET( pt   != NULL );
    ECP_VALIDATE_RET( olen != NULL );
    ECP_VALIDATE_RET( buf  != NULL );
    ECP_VALIDATE_RET( format == MBEDTLS_ECP_PF_UNCOMPRESSED ||
                      format == MBEDTLS_ECP_PF_COMPRESSED );

    /*
     * buffer length must be at least one, for our length byte
     */
    if( blen < 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_point_write_binary( grp, pt, format,
                    olen, buf + 1, blen - 1) ) != 0 )
        return( ret );

    /*
     * write length to the first byte and update total length
     */
    buf[0] = (unsigned char) *olen;
    ++*olen;

    return( 0 );
}